

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  ulong *puVar26;
  undefined4 uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  ulong unaff_R13;
  size_t mask;
  ulong uVar36;
  ulong uVar37;
  bool bVar38;
  uint uVar39;
  undefined1 auVar40 [16];
  uint uVar44;
  uint uVar45;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  uint uVar46;
  undefined1 auVar43 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [64];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  NodeRef stack [564];
  ulong *local_1400;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1400 = local_11f8;
  local_1200 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar52._4_4_ = fVar1;
  auVar52._0_4_ = fVar1;
  auVar52._8_4_ = fVar1;
  auVar52._12_4_ = fVar1;
  auVar52._16_4_ = fVar1;
  auVar52._20_4_ = fVar1;
  auVar52._24_4_ = fVar1;
  auVar52._28_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar54._4_4_ = fVar2;
  auVar54._0_4_ = fVar2;
  auVar54._8_4_ = fVar2;
  auVar54._12_4_ = fVar2;
  auVar54._16_4_ = fVar2;
  auVar54._20_4_ = fVar2;
  auVar54._24_4_ = fVar2;
  auVar54._28_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar58._4_4_ = fVar3;
  auVar58._0_4_ = fVar3;
  auVar58._8_4_ = fVar3;
  auVar58._12_4_ = fVar3;
  auVar58._16_4_ = fVar3;
  auVar58._20_4_ = fVar3;
  auVar58._24_4_ = fVar3;
  auVar58._28_4_ = fVar3;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar65._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar65._8_4_ = -fVar1;
  auVar65._12_4_ = -fVar1;
  auVar65._16_4_ = -fVar1;
  auVar65._20_4_ = -fVar1;
  auVar65._24_4_ = -fVar1;
  auVar65._28_4_ = -fVar1;
  auVar67._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar67._8_4_ = -fVar2;
  auVar67._12_4_ = -fVar2;
  auVar67._16_4_ = -fVar2;
  auVar67._20_4_ = -fVar2;
  auVar67._24_4_ = -fVar2;
  auVar67._28_4_ = -fVar2;
  iVar4 = (tray->tnear).field_0.i[k];
  auVar69._4_4_ = iVar4;
  auVar69._0_4_ = iVar4;
  auVar69._8_4_ = iVar4;
  auVar69._12_4_ = iVar4;
  auVar69._16_4_ = iVar4;
  auVar69._20_4_ = iVar4;
  auVar69._24_4_ = iVar4;
  auVar69._28_4_ = iVar4;
  iVar4 = (tray->tfar).field_0.i[k];
  auVar71._4_4_ = iVar4;
  auVar71._0_4_ = iVar4;
  auVar71._8_4_ = iVar4;
  auVar71._12_4_ = iVar4;
  auVar71._16_4_ = iVar4;
  auVar71._20_4_ = iVar4;
  auVar71._24_4_ = iVar4;
  auVar71._28_4_ = iVar4;
  auVar63._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar63._8_4_ = -fVar3;
  auVar63._12_4_ = -fVar3;
  auVar63._16_4_ = -fVar3;
  auVar63._20_4_ = -fVar3;
  auVar63._24_4_ = -fVar3;
  auVar63._28_4_ = -fVar3;
  auVar41._8_4_ = 0x7fffffff;
  auVar41._0_8_ = 0x7fffffff7fffffff;
  auVar41._12_4_ = 0x7fffffff;
  auVar41._16_4_ = 0x7fffffff;
  auVar41._20_4_ = 0x7fffffff;
  auVar41._24_4_ = 0x7fffffff;
  auVar41._28_4_ = 0x7fffffff;
  do {
    puVar26 = local_1400;
    auVar68 = ZEXT3264(auVar67);
    auVar62 = ZEXT3264(auVar58);
    if (local_1400 == &local_1200) break;
    uVar37 = local_1400[-1];
    local_1400 = local_1400 + -1;
    do {
      if ((uVar37 & 8) == 0) {
        auVar40 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar31),auVar65,auVar52);
        auVar16 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar32),auVar67,auVar54);
        auVar53 = vpmaxsd_avx2(ZEXT1632(auVar40),ZEXT1632(auVar16));
        auVar40 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar37 + 0x40 + uVar33),auVar63,auVar58);
        auVar74 = vpmaxsd_avx2(ZEXT1632(auVar40),auVar69);
        auVar53 = vpmaxsd_avx2(auVar53,auVar74);
        auVar40 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar37 + 0x40 + (uVar31 ^ 0x20)),auVar65,
                                  auVar52);
        auVar16 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar37 + 0x40 + (uVar32 ^ 0x20)),auVar67,
                                  auVar54);
        auVar74 = vpminsd_avx2(ZEXT1632(auVar40),ZEXT1632(auVar16));
        auVar40 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar37 + 0x40 + (uVar33 ^ 0x20)),auVar63,
                                  auVar58);
        auVar75 = vpminsd_avx2(ZEXT1632(auVar40),auVar71);
        auVar74 = vpminsd_avx2(auVar74,auVar75);
        auVar53 = vpcmpgtd_avx2(auVar53,auVar74);
        uVar27 = vmovmskps_avx(auVar53);
        unaff_R13 = (ulong)(byte)~(byte)uVar27;
      }
      if ((uVar37 & 8) == 0) {
        if (unaff_R13 == 0) {
          uVar35 = 4;
        }
        else {
          uVar36 = uVar37 & 0xfffffffffffffff0;
          lVar34 = 0;
          for (uVar37 = unaff_R13; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
            lVar34 = lVar34 + 1;
          }
          uVar35 = 0;
          for (uVar28 = unaff_R13 - 1 & unaff_R13; uVar37 = *(ulong *)(uVar36 + lVar34 * 8),
              uVar28 != 0; uVar28 = uVar28 - 1 & uVar28) {
            *local_1400 = uVar37;
            local_1400 = local_1400 + 1;
            lVar34 = 0;
            for (uVar37 = uVar28; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
              lVar34 = lVar34 + 1;
            }
          }
        }
      }
      else {
        uVar35 = 6;
      }
    } while (uVar35 == 0);
    if (uVar35 == 6) {
      uVar36 = (ulong)((uint)uVar37 & 0xf);
      uVar35 = 0;
      uVar28 = uVar36 - 8;
      bVar38 = uVar36 != 8;
      if (bVar38) {
        uVar27 = *(undefined4 *)(ray + k * 4);
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x10);
        uVar6 = *(undefined4 *)(ray + k * 4 + 0x20);
        fVar1 = *(float *)(ray + k * 4 + 0x40);
        auVar74._4_4_ = fVar1;
        auVar74._0_4_ = fVar1;
        auVar74._8_4_ = fVar1;
        auVar74._12_4_ = fVar1;
        auVar74._16_4_ = fVar1;
        auVar74._20_4_ = fVar1;
        auVar74._24_4_ = fVar1;
        auVar74._28_4_ = fVar1;
        fVar2 = *(float *)(ray + k * 4 + 0x50);
        auVar75._4_4_ = fVar2;
        auVar75._0_4_ = fVar2;
        auVar75._8_4_ = fVar2;
        auVar75._12_4_ = fVar2;
        auVar75._16_4_ = fVar2;
        auVar75._20_4_ = fVar2;
        auVar75._24_4_ = fVar2;
        auVar75._28_4_ = fVar2;
        uVar37 = uVar37 & 0xfffffffffffffff0;
        fVar3 = *(float *)(ray + k * 4 + 0x60);
        auVar53._4_4_ = fVar3;
        auVar53._0_4_ = fVar3;
        auVar53._8_4_ = fVar3;
        auVar53._12_4_ = fVar3;
        auVar53._16_4_ = fVar3;
        auVar53._20_4_ = fVar3;
        auVar53._24_4_ = fVar3;
        auVar53._28_4_ = fVar3;
        uVar36 = 0;
        do {
          lVar29 = uVar36 * 0xe0;
          lVar34 = uVar37 + 0xc0 + lVar29;
          local_1220 = *(undefined8 *)(lVar34 + 0x10);
          uStack_1218 = *(undefined8 *)(lVar34 + 0x18);
          uStack_1210 = local_1220;
          uStack_1208 = uStack_1218;
          auVar64._16_16_ = *(undefined1 (*) [16])(uVar37 + 0x60 + lVar29);
          auVar64._0_16_ = *(undefined1 (*) [16])(uVar37 + lVar29);
          auVar66._16_16_ = *(undefined1 (*) [16])(uVar37 + 0x70 + lVar29);
          auVar66._0_16_ = *(undefined1 (*) [16])(uVar37 + 0x10 + lVar29);
          auVar73._16_16_ = *(undefined1 (*) [16])(uVar37 + 0x80 + lVar29);
          auVar73._0_16_ = *(undefined1 (*) [16])(uVar37 + 0x20 + lVar29);
          auVar40 = *(undefined1 (*) [16])(uVar37 + 0x30 + lVar29);
          auVar42._16_16_ = auVar40;
          auVar42._0_16_ = auVar40;
          auVar40 = *(undefined1 (*) [16])(uVar37 + 0x40 + lVar29);
          auVar47._16_16_ = auVar40;
          auVar47._0_16_ = auVar40;
          auVar40 = *(undefined1 (*) [16])(uVar37 + 0x50 + lVar29);
          auVar50._16_16_ = auVar40;
          auVar50._0_16_ = auVar40;
          auVar40 = *(undefined1 (*) [16])(uVar37 + 0x90 + lVar29);
          auVar70._16_16_ = auVar40;
          auVar70._0_16_ = auVar40;
          auVar16 = *(undefined1 (*) [16])(uVar37 + 0xa0 + lVar29);
          auVar72._16_16_ = auVar16;
          auVar72._0_16_ = auVar16;
          auVar8 = *(undefined1 (*) [16])(uVar37 + 0xb0 + lVar29);
          auVar55._16_16_ = auVar8;
          auVar55._0_16_ = auVar8;
          auVar42 = vsubps_avx(auVar64,auVar42);
          auVar49 = vsubps_avx(auVar66,auVar47);
          auVar9 = vsubps_avx(auVar73,auVar50);
          auVar47 = vsubps_avx(auVar70,auVar64);
          auVar43 = vsubps_avx(auVar72,auVar66);
          auVar10 = vsubps_avx(auVar55,auVar73);
          auVar11._4_4_ = auVar49._4_4_ * auVar10._4_4_;
          auVar11._0_4_ = auVar49._0_4_ * auVar10._0_4_;
          auVar11._8_4_ = auVar49._8_4_ * auVar10._8_4_;
          auVar11._12_4_ = auVar49._12_4_ * auVar10._12_4_;
          auVar11._16_4_ = auVar49._16_4_ * auVar10._16_4_;
          auVar11._20_4_ = auVar49._20_4_ * auVar10._20_4_;
          auVar11._24_4_ = auVar49._24_4_ * auVar10._24_4_;
          auVar11._28_4_ = auVar40._12_4_;
          auVar17 = vfmsub231ps_fma(auVar11,auVar43,auVar9);
          auVar12._4_4_ = auVar47._4_4_ * auVar9._4_4_;
          auVar12._0_4_ = auVar47._0_4_ * auVar9._0_4_;
          auVar12._8_4_ = auVar47._8_4_ * auVar9._8_4_;
          auVar12._12_4_ = auVar47._12_4_ * auVar9._12_4_;
          auVar12._16_4_ = auVar47._16_4_ * auVar9._16_4_;
          auVar12._20_4_ = auVar47._20_4_ * auVar9._20_4_;
          auVar12._24_4_ = auVar47._24_4_ * auVar9._24_4_;
          auVar12._28_4_ = auVar16._12_4_;
          auVar18 = vfmsub231ps_fma(auVar12,auVar10,auVar42);
          auVar25._4_4_ = uVar27;
          auVar25._0_4_ = uVar27;
          auVar25._8_4_ = uVar27;
          auVar25._12_4_ = uVar27;
          auVar25._16_4_ = uVar27;
          auVar25._20_4_ = uVar27;
          auVar25._24_4_ = uVar27;
          auVar25._28_4_ = uVar27;
          auVar11 = vsubps_avx(auVar64,auVar25);
          auVar24._4_4_ = uVar5;
          auVar24._0_4_ = uVar5;
          auVar24._8_4_ = uVar5;
          auVar24._12_4_ = uVar5;
          auVar24._16_4_ = uVar5;
          auVar24._20_4_ = uVar5;
          auVar24._24_4_ = uVar5;
          auVar24._28_4_ = uVar5;
          auVar12 = vsubps_avx(auVar66,auVar24);
          auVar13._4_4_ = uVar6;
          auVar13._0_4_ = uVar6;
          auVar13._8_4_ = uVar6;
          auVar13._12_4_ = uVar6;
          auVar13._16_4_ = uVar6;
          auVar13._20_4_ = uVar6;
          auVar13._24_4_ = uVar6;
          auVar13._28_4_ = uVar6;
          auVar13 = vsubps_avx(auVar73,auVar13);
          auVar61._0_4_ = fVar1 * auVar12._0_4_;
          auVar61._4_4_ = fVar1 * auVar12._4_4_;
          auVar61._8_4_ = fVar1 * auVar12._8_4_;
          auVar61._12_4_ = fVar1 * auVar12._12_4_;
          auVar61._16_4_ = fVar1 * auVar12._16_4_;
          auVar61._20_4_ = fVar1 * auVar12._20_4_;
          auVar61._28_36_ = auVar62._28_36_;
          auVar61._24_4_ = fVar1 * auVar12._24_4_;
          auVar40 = vfmsub231ps_fma(auVar61._0_32_,auVar11,auVar75);
          auVar21._4_4_ = auVar10._4_4_ * auVar40._4_4_;
          auVar21._0_4_ = auVar10._0_4_ * auVar40._0_4_;
          auVar21._8_4_ = auVar10._8_4_ * auVar40._8_4_;
          auVar21._12_4_ = auVar10._12_4_ * auVar40._12_4_;
          auVar21._16_4_ = auVar10._16_4_ * 0.0;
          auVar21._20_4_ = auVar10._20_4_ * 0.0;
          auVar21._24_4_ = auVar10._24_4_ * 0.0;
          auVar21._28_4_ = auVar10._28_4_;
          auVar10._4_4_ = auVar9._4_4_ * auVar40._4_4_;
          auVar10._0_4_ = auVar9._0_4_ * auVar40._0_4_;
          auVar10._8_4_ = auVar9._8_4_ * auVar40._8_4_;
          auVar10._12_4_ = auVar9._12_4_ * auVar40._12_4_;
          auVar10._16_4_ = auVar9._16_4_ * 0.0;
          auVar10._20_4_ = auVar9._20_4_ * 0.0;
          auVar10._24_4_ = auVar9._24_4_ * 0.0;
          auVar10._28_4_ = auVar9._28_4_;
          auVar59._0_4_ = fVar3 * auVar11._0_4_;
          auVar59._4_4_ = fVar3 * auVar11._4_4_;
          auVar59._8_4_ = fVar3 * auVar11._8_4_;
          auVar59._12_4_ = fVar3 * auVar11._12_4_;
          auVar59._16_4_ = fVar3 * auVar11._16_4_;
          auVar59._20_4_ = fVar3 * auVar11._20_4_;
          auVar59._24_4_ = fVar3 * auVar11._24_4_;
          auVar59._28_4_ = 0;
          auVar16 = vfmsub231ps_fma(auVar59,auVar13,auVar74);
          auVar40 = vfmadd231ps_fma(auVar21,ZEXT1632(auVar16),auVar43);
          auVar9._4_4_ = auVar42._4_4_ * auVar43._4_4_;
          auVar9._0_4_ = auVar42._0_4_ * auVar43._0_4_;
          auVar9._8_4_ = auVar42._8_4_ * auVar43._8_4_;
          auVar9._12_4_ = auVar42._12_4_ * auVar43._12_4_;
          auVar9._16_4_ = auVar42._16_4_ * auVar43._16_4_;
          auVar9._20_4_ = auVar42._20_4_ * auVar43._20_4_;
          auVar9._24_4_ = auVar42._24_4_ * auVar43._24_4_;
          auVar9._28_4_ = auVar43._28_4_;
          auVar19 = vfmsub231ps_fma(auVar9,auVar47,auVar49);
          auVar16 = vfmadd231ps_fma(auVar10,auVar49,ZEXT1632(auVar16));
          auVar60._0_4_ = fVar2 * auVar13._0_4_;
          auVar60._4_4_ = fVar2 * auVar13._4_4_;
          auVar60._8_4_ = fVar2 * auVar13._8_4_;
          auVar60._12_4_ = fVar2 * auVar13._12_4_;
          auVar60._16_4_ = fVar2 * auVar13._16_4_;
          auVar60._20_4_ = fVar2 * auVar13._20_4_;
          auVar60._24_4_ = fVar2 * auVar13._24_4_;
          auVar60._28_4_ = 0;
          auVar20 = vfmsub231ps_fma(auVar60,auVar12,auVar53);
          auVar62._0_4_ = auVar19._0_4_ * fVar3;
          auVar62._4_4_ = auVar19._4_4_ * fVar3;
          auVar62._8_4_ = auVar19._8_4_ * fVar3;
          auVar62._12_4_ = auVar19._12_4_ * fVar3;
          auVar62._16_4_ = fVar3 * 0.0;
          auVar62._20_4_ = fVar3 * 0.0;
          auVar62._28_36_ = auVar68._28_36_;
          auVar62._24_4_ = fVar3 * 0.0;
          auVar8 = vfmadd231ps_fma(auVar62._0_32_,ZEXT1632(auVar18),auVar75);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar17),auVar74);
          auVar68 = ZEXT1664(auVar8);
          auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),ZEXT1632(auVar20),auVar47);
          auVar49._8_4_ = 0x80000000;
          auVar49._0_8_ = 0x8000000080000000;
          auVar49._12_4_ = 0x80000000;
          auVar49._16_4_ = 0x80000000;
          auVar49._20_4_ = 0x80000000;
          auVar49._24_4_ = 0x80000000;
          auVar49._28_4_ = 0x80000000;
          auVar49 = vandps_avx(ZEXT1632(auVar8),auVar49);
          uVar39 = auVar49._0_4_;
          auVar56._0_4_ = (float)(uVar39 ^ auVar40._0_4_);
          uVar44 = auVar49._4_4_;
          auVar56._4_4_ = (float)(uVar44 ^ auVar40._4_4_);
          uVar45 = auVar49._8_4_;
          auVar56._8_4_ = (float)(uVar45 ^ auVar40._8_4_);
          uVar46 = auVar49._12_4_;
          auVar56._12_4_ = (float)(uVar46 ^ auVar40._12_4_);
          auVar43._16_4_ = auVar49._16_4_;
          auVar56._16_4_ = auVar43._16_4_;
          auVar43._20_4_ = auVar49._20_4_;
          auVar56._20_4_ = auVar43._20_4_;
          auVar43._24_4_ = auVar49._24_4_;
          auVar56._24_4_ = auVar43._24_4_;
          auVar43._28_4_ = auVar49._28_4_;
          auVar56._28_4_ = auVar43._28_4_;
          auVar40 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar42,ZEXT1632(auVar20));
          auVar51._0_4_ = (float)(uVar39 ^ auVar40._0_4_);
          auVar51._4_4_ = (float)(uVar44 ^ auVar40._4_4_);
          auVar51._8_4_ = (float)(uVar45 ^ auVar40._8_4_);
          auVar51._12_4_ = (float)(uVar46 ^ auVar40._12_4_);
          auVar51._16_4_ = auVar43._16_4_;
          auVar51._20_4_ = auVar43._20_4_;
          auVar51._24_4_ = auVar43._24_4_;
          auVar51._28_4_ = auVar43._28_4_;
          auVar49 = vcmpps_avx(auVar56,ZEXT832(0) << 0x20,5);
          auVar42 = vcmpps_avx(auVar51,ZEXT832(0) << 0x20,5);
          auVar49 = vandps_avx(auVar42,auVar49);
          auVar62 = ZEXT3264(auVar49);
          auVar42 = vcmpps_avx(ZEXT1632(auVar8),ZEXT832(0) << 0x20,4);
          auVar49 = vandps_avx(auVar42,auVar49);
          auVar57._0_4_ = auVar56._0_4_ + auVar51._0_4_;
          auVar57._4_4_ = auVar56._4_4_ + auVar51._4_4_;
          auVar57._8_4_ = auVar56._8_4_ + auVar51._8_4_;
          auVar57._12_4_ = auVar56._12_4_ + auVar51._12_4_;
          auVar57._16_4_ = auVar43._16_4_ + auVar43._16_4_;
          auVar57._20_4_ = auVar43._20_4_ + auVar43._20_4_;
          auVar57._24_4_ = auVar43._24_4_ + auVar43._24_4_;
          auVar57._28_4_ = auVar43._28_4_ + auVar43._28_4_;
          auVar42 = vandps_avx(ZEXT1632(auVar8),auVar41);
          auVar9 = vcmpps_avx(auVar57,auVar42,2);
          auVar47 = auVar9 & auVar49;
          if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar47 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar47 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar47 >> 0x7f,0) != '\0') ||
                (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar47 >> 0xbf,0) != '\0') ||
              (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar47[0x1f] < '\0') {
            auVar49 = vandps_avx(auVar49,auVar9);
            auVar40 = vpackssdw_avx(auVar49._0_16_,auVar49._16_16_);
            auVar48._0_4_ = auVar13._0_4_ * auVar19._0_4_;
            auVar48._4_4_ = auVar13._4_4_ * auVar19._4_4_;
            auVar48._8_4_ = auVar13._8_4_ * auVar19._8_4_;
            auVar48._12_4_ = auVar13._12_4_ * auVar19._12_4_;
            auVar48._16_4_ = auVar13._16_4_ * 0.0;
            auVar48._20_4_ = auVar13._20_4_ * 0.0;
            auVar48._24_4_ = auVar13._24_4_ * 0.0;
            auVar48._28_4_ = 0;
            auVar16 = vfmadd213ps_fma(auVar12,ZEXT1632(auVar18),auVar48);
            auVar16 = vfmadd213ps_fma(auVar11,ZEXT1632(auVar17),ZEXT1632(auVar16));
            auVar43._0_4_ = uVar39 ^ auVar16._0_4_;
            auVar43._4_4_ = uVar44 ^ auVar16._4_4_;
            auVar43._8_4_ = uVar45 ^ auVar16._8_4_;
            auVar43._12_4_ = uVar46 ^ auVar16._12_4_;
            fVar7 = *(float *)(ray + k * 4 + 0x30);
            auVar22._4_4_ = auVar42._4_4_ * fVar7;
            auVar22._0_4_ = auVar42._0_4_ * fVar7;
            auVar22._8_4_ = auVar42._8_4_ * fVar7;
            auVar22._12_4_ = auVar42._12_4_ * fVar7;
            auVar22._16_4_ = auVar42._16_4_ * fVar7;
            auVar22._20_4_ = auVar42._20_4_ * fVar7;
            auVar22._24_4_ = auVar42._24_4_ * fVar7;
            auVar22._28_4_ = fVar7;
            auVar49 = vcmpps_avx(auVar22,auVar43,1);
            fVar7 = *(float *)(ray + k * 4 + 0x80);
            auVar62 = ZEXT3264(CONCAT428(fVar7,CONCAT424(fVar7,CONCAT420(fVar7,CONCAT416(fVar7,
                                                  CONCAT412(fVar7,CONCAT48(fVar7,CONCAT44(fVar7,
                                                  fVar7))))))));
            auVar23._4_4_ = auVar42._4_4_ * fVar7;
            auVar23._0_4_ = auVar42._0_4_ * fVar7;
            auVar23._8_4_ = auVar42._8_4_ * fVar7;
            auVar23._12_4_ = auVar42._12_4_ * fVar7;
            auVar23._16_4_ = auVar42._16_4_ * fVar7;
            auVar23._20_4_ = auVar42._20_4_ * fVar7;
            auVar23._24_4_ = auVar42._24_4_ * fVar7;
            auVar23._28_4_ = auVar42._28_4_;
            auVar42 = vcmpps_avx(auVar43,auVar23,2);
            auVar49 = vandps_avx(auVar49,auVar42);
            auVar16 = vpackssdw_avx(auVar49._0_16_,auVar49._16_16_);
            auVar40 = vpand_avx(auVar16,auVar40);
            auVar49 = vpmovzxwd_avx2(auVar40);
            auVar49 = vpslld_avx2(auVar49,0x1f);
            if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar49 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar49 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar49 >> 0x7f,0) != '\0') ||
                  (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar49 >> 0xbf,0) != '\0') ||
                (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar49[0x1f] < '\0') {
              auVar40 = vpsllw_avx(auVar40,0xf);
              auVar40 = vpacksswb_avx(auVar40,auVar40);
              uVar30 = (ulong)(byte)(SUB161(auVar40 >> 7,0) & 1 |
                                     (SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar40 >> 0x3f,0) << 7);
              do {
                uVar14 = 0;
                for (uVar15 = uVar30; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000)
                {
                  uVar14 = uVar14 + 1;
                }
                if ((((context->scene->geometries).items[*(uint *)((long)&local_1220 + uVar14 * 4)].
                     ptr)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if (bVar38) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar35 = 1;
                  }
                  goto LAB_0065ea8b;
                }
                uVar30 = uVar30 ^ 1L << (uVar14 & 0x3f);
              } while (uVar30 != 0);
            }
          }
          uVar36 = uVar36 + 1;
          bVar38 = uVar36 < uVar28;
        } while (uVar36 != uVar28);
      }
    }
LAB_0065ea8b:
  } while ((uVar35 & 3) == 0);
  return puVar26 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }